

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O3

Pass * wasm::createReReloopPass(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Pass *pPVar2;
  
  pPVar2 = (Pass *)operator_new(0x90);
  (pPVar2->name)._M_dataplus._M_p = (pointer)0x0;
  (pPVar2->name)._M_string_length = 0;
  (pPVar2->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pPVar2->name).field_2 + 8) = 0;
  pPVar2->_vptr_Pass = (_func_int **)0x0;
  pPVar2->runner = (PassRunner *)0x0;
  pPVar2[1].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar2[1].name.field_2 + 8) = 0;
  pPVar2[1].name._M_dataplus._M_p = (pointer)0x0;
  pPVar2[1].name._M_string_length = 0;
  pPVar2[1]._vptr_Pass = (_func_int **)0x0;
  pPVar2[1].runner = (PassRunner *)0x0;
  paVar1 = &pPVar2[1].name.field_2;
  (pPVar2->name)._M_dataplus._M_p = (pointer)&(pPVar2->name).field_2;
  (pPVar2->name).field_2._M_local_buf[0] = '\0';
  pPVar2->_vptr_Pass = (_func_int **)&PTR__ReReloop_00d75cb0;
  *(undefined8 *)((long)&pPVar2[1].name.field_2 + 8) = 0;
  pPVar2[1].name._M_dataplus._M_p = (pointer)0x0;
  pPVar2[2]._vptr_Pass = (_func_int **)paVar1;
  pPVar2[2].runner = (PassRunner *)paVar1;
  pPVar2[2].name._M_dataplus._M_p = (pointer)0x0;
  pPVar2[2].name._M_string_length = 0;
  pPVar2[2].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar2[2].name.field_2 + 8) = 0;
  return pPVar2;
}

Assistant:

Pass* createReReloopPass() { return new ReReloop(); }